

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpf_dump.c
# Opt level: O2

void bpf_dump(bpf_program *p,int option)

{
  char *__s;
  bpf_insn *p_00;
  u_int n;
  long lVar1;
  u_int uVar2;
  
  p_00 = p->bf_insns;
  uVar2 = 0;
  if (0 < (int)p->bf_len) {
    uVar2 = p->bf_len;
  }
  if (option < 3) {
    if (option == 2) {
      for (lVar1 = 0; uVar2 != (u_int)lVar1; lVar1 = lVar1 + 1) {
        printf("{ 0x%x, %d, %d, 0x%08x },\n",(ulong)p_00[lVar1].code,(ulong)p_00[lVar1].jt,
               (ulong)p_00[lVar1].jf,(ulong)p_00[lVar1].k);
      }
    }
    else {
      for (n = 0; uVar2 != n; n = n + 1) {
        __s = bpf_image(p_00,n);
        puts(__s);
        p_00 = p_00 + 1;
      }
    }
  }
  else {
    printf("%d\n");
    for (lVar1 = 0; uVar2 != (u_int)lVar1; lVar1 = lVar1 + 1) {
      printf("%u %u %u %u\n",(ulong)p_00[lVar1].code,(ulong)p_00[lVar1].jt,(ulong)p_00[lVar1].jf,
             (ulong)p_00[lVar1].k);
    }
  }
  return;
}

Assistant:

void
bpf_dump(const struct bpf_program *p, int option)
{
	const struct bpf_insn *insn;
	int i;
	int n = p->bf_len;

	insn = p->bf_insns;
	if (option > 2) {
		printf("%d\n", n);
		for (i = 0; i < n; ++insn, ++i) {
			printf("%u %u %u %u\n", insn->code,
			       insn->jt, insn->jf, insn->k);
		}
		return ;
	}
	if (option > 1) {
		for (i = 0; i < n; ++insn, ++i)
			printf("{ 0x%x, %d, %d, 0x%08x },\n",
			       insn->code, insn->jt, insn->jf, insn->k);
		return;
	}
	for (i = 0; i < n; ++insn, ++i) {
#ifdef BDEBUG
		extern int bids[];
		if (bids[i] > 0)
			printf("[%02d]", bids[i] - 1);
		else
			printf(" -- ");
#endif
		puts(bpf_image(insn, i));
	}
}